

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SimpleDictionaryTypeHandler.cpp
# Opt level: O2

bool __thiscall
Js::SimpleDictionaryTypeHandlerBase<int,_Js::JavascriptString_*,_false>::
IsObjTypeSpecEquivalentImpl<false>
          (SimpleDictionaryTypeHandlerBase<int,_Js::JavascriptString_*,_false> *this,Type *type,
          EquivalentPropertyEntry *entry)

{
  int iVar1;
  bool bVar2;
  PropertyIndex PVar3;
  ScriptContext *this_00;
  PropertyRecord *local_30;
  PropertyRecord *propertyRecord;
  SimpleDictionaryPropertyDescriptor<int> *descriptor;
  
  this_00 = Js::Type::GetScriptContext(type);
  local_30 = ScriptContext::GetPropertyName(this_00,entry->propertyId);
  bVar2 = JsUtil::
          BaseDictionary<Js::JavascriptString*,Js::SimpleDictionaryPropertyDescriptor<int>,Memory::RecyclerNonLeafAllocator,DictionarySizePolicy<PowerOf2Policy,1u,2u,1u,4u>,Js::PropertyRecordStringHashComparer,Js::PropertyMapKeyTraits<Js::JavascriptString*>::Entry,JsUtil::NoResizeLock>
          ::TryGetReference<Js::PropertyRecord_const*>
                    ((BaseDictionary<Js::JavascriptString*,Js::SimpleDictionaryPropertyDescriptor<int>,Memory::RecyclerNonLeafAllocator,DictionarySizePolicy<PowerOf2Policy,1u,2u,1u,4u>,Js::PropertyRecordStringHashComparer,Js::PropertyMapKeyTraits<Js::JavascriptString*>::Entry,JsUtil::NoResizeLock>
                      *)(this->propertyMap).ptr,&local_30,
                     (SimpleDictionaryPropertyDescriptor<int> **)&propertyRecord);
  if ((((bVar2) &&
       (((ulong)(propertyRecord->super_FinalizableObject).super_IRecyclerVisitedObject.
                _vptr_IRecyclerVisitedObject & 0x800) == 0)) &&
      (iVar1 = *(int *)((long)&(propertyRecord->super_FinalizableObject).
                               super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject + 4),
      iVar1 < 0xffff)) &&
     (PVar3 = DynamicTypeHandler::AdjustValidSlotIndexForInlineSlots
                        (&this->super_DynamicTypeHandler,(PropertyIndex)iVar1), PVar3 != 0xffff)) {
    if (((PVar3 != entry->slotIndex) ||
        (entry->isAuxSlot != (int)(uint)(this->super_DynamicTypeHandler).inlineSlotCapacity <= iVar1
        )) || ((entry->mustBeWritable == true &&
               ((((ulong)(propertyRecord->super_FinalizableObject).super_IRecyclerVisitedObject.
                         _vptr_IRecyclerVisitedObject & 0x400) == 0 ||
                (((ulong)(propertyRecord->super_FinalizableObject).super_IRecyclerVisitedObject.
                         _vptr_IRecyclerVisitedObject & 6) != 2)))))) {
      return false;
    }
  }
  else {
    if (entry->slotIndex != 0xffff) {
      return false;
    }
    if (entry->mustBeWritable != false) {
      return false;
    }
  }
  return true;
}

Assistant:

bool SimpleDictionaryTypeHandlerBase<TPropertyIndex, TMapKey, IsNotExtensibleSupported>::IsObjTypeSpecEquivalentImpl(const Type* type, const EquivalentPropertyEntry *entry)
    {
        TPropertyIndex absSlotIndex = Constants::NoSlot;
        PropertyIndex relSlotIndex = Constants::NoSlot;

        ScriptContext* scriptContext = type->GetScriptContext();

        const PropertyRecord* propertyRecord =
            doLock ? scriptContext->GetPropertyNameLocked(entry->propertyId) : scriptContext->GetPropertyName(entry->propertyId);
        SimpleDictionaryPropertyDescriptor<TPropertyIndex>* descriptor;
        if (this->propertyMap->TryGetReference(propertyRecord, &descriptor) && !(descriptor->Attributes & PropertyDeleted))
        {
            absSlotIndex = descriptor->propertyIndex;
            if (absSlotIndex <= Constants::PropertyIndexMax)
            {
                relSlotIndex = AdjustValidSlotIndexForInlineSlots(static_cast<PropertyIndex>(absSlotIndex));
            }
        }

        if (relSlotIndex != Constants::NoSlot)
        {
            if (relSlotIndex != entry->slotIndex || ((absSlotIndex >= GetInlineSlotCapacity()) != entry->isAuxSlot))
            {
                return false;
            }

            if (entry->mustBeWritable && (!(descriptor->Attributes & PropertyWritable) || descriptor->IsOrMayBecomeFixed()))
            {
                return false;
            }
        }
        else
        {
            if (entry->slotIndex != Constants::NoSlot || entry->mustBeWritable)
            {
                return false;
            }
        }

        return true;
    }